

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

string * __thiscall positionTy::dbgTxt_abi_cxx11_(positionTy *this)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  char *pcVar4;
  char *pcVar5;
  positionTy *in_RSI;
  string *in_RDI;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  double dVar10;
  char buf [200];
  char *local_1a8;
  char *local_188;
  char *local_178;
  allocator<char> local_11d [12];
  flightPhaseE in_stack_fffffffffffffeef;
  bool local_109;
  string local_108 [32];
  char local_e8 [224];
  
  dVar6 = ts(in_RSI);
  dVar7 = lat(in_RSI);
  dVar8 = lon(in_RSI);
  dVar9 = alt_ft((positionTy *)0x12e9b2);
  pcVar4 = GrndE2String(SUB21(in_RSI->f,1) & (GND_ON|GND_OFF));
  pcVar5 = SpecialPosE2String(SUB21(in_RSI->f,1) >> 4 & SPOS_RWY);
  if (((ushort)in_RSI->f >> 0xe & 1) == 0) {
    local_178 = "  ";
  }
  else {
    local_178 = "CT";
  }
  local_109 = ((ushort)in_RSI->f & 0x7f) == 0;
  if (local_109) {
    local_188 = "";
  }
  else {
    LTAircraft::FlightPhase2String_abi_cxx11_(in_stack_fffffffffffffeef);
    local_188 = (char *)std::__cxx11::string::c_str();
  }
  local_109 = !local_109;
  bVar1 = HasTaxiEdge(in_RSI);
  bVar2 = HasTaxiEdge(in_RSI);
  if (bVar2) {
    local_1a8 = (char *)in_RSI->edgeIdx;
  }
  else {
    local_1a8 = (char *)0x0;
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)heading(in_RSI);
  uVar3 = 0x20;
  if (((ushort)in_RSI->f & 0x80) != 0) {
    uVar3 = 0x2a;
  }
  __a = (allocator<char> *)pitch(in_RSI);
  dVar10 = roll(in_RSI);
  snprintf(local_e8,200,
           "%.1f: (%7.5f, %7.5f) %7.1fft %8.8s %3.3s %2.2s %-13.13s %4.*zu {h %3.0f%c, p %3.0f, r %3.0f}"
           ,dVar6,dVar7,dVar8,dVar9,this_00,__a,dVar10,pcVar4,pcVar5,local_178,local_188,bVar1,
           local_1a8,uVar3);
  if (local_109) {
    std::__cxx11::string::~string(local_108);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,local_1a8,__a);
  std::allocator<char>::~allocator(local_11d);
  return in_RDI;
}

Assistant:

std::string positionTy::dbgTxt () const
{
    char buf[200];
    snprintf(buf, sizeof(buf), "%.1f: (%7.5f, %7.5f) %7.1fft %8.8s %3.3s %2.2s %-13.13s %4.*zu {h %3.0f%c, p %3.0f, r %3.0f}",
             ts(),
             lat(), lon(),
             alt_ft(),
             GrndE2String(f.onGrnd),
             SpecialPosE2String(f.specialPos),
             f.bCutCorner ? "CT" : "  ",
             f.flightPhase ? (LTAircraft::FlightPhase2String(f.flightPhase)).c_str() : "",
             HasTaxiEdge() ? 1 : 0,
             HasTaxiEdge() ? edgeIdx : 0,
             heading(),
             (f.bHeadFixed ? '*' : ' '),
             pitch(), roll());
    return std::string(buf);
}